

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTWave_GetState(FACTWave *pWave,uint32_t *pdwState)

{
  if (pWave == (FACTWave *)0x0) {
    *pdwState = 0;
  }
  else {
    FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
    *pdwState = pWave->state;
    FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
  }
  return (uint)(pWave == (FACTWave *)0x0);
}

Assistant:

uint32_t FACTWave_GetState(FACTWave *pWave, uint32_t *pdwState)
{
	if (pWave == NULL)
	{
		*pdwState = 0;
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
	*pdwState = pWave->state;
	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}